

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O3

sha1_hash * __thiscall
libtorrent::session_handle::dht_put_item
          (sha1_hash *__return_storage_ptr__,session_handle *this,entry *data)

{
  span<const_char> data_00;
  vector<char,_std::allocator<char>_> buf;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> local_40;
  vector<char,_std::allocator<char>_> local_38;
  bencode_visitor<std::back_insert_iterator<std::vector<char,_std::allocator<char>_>_>_> local_20;
  
  local_40.container = &local_38;
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_20.out = &local_40;
  ::std::
  visit<libtorrent::aux::bencode_visitor<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>,std::variant<long,std::__cxx11::string,std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>,boost::container::map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>,std::vector<char,std::allocator<char>>,libtorrent::entry_types::uninitialized_type>const&>
            (&local_20,&data->super_variant_type);
  data_00.m_len =
       (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  data_00.m_ptr =
       local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start;
  lcrypto::hasher::hasher((hasher *)&local_40,data_00);
  lcrypto::hasher::final(__return_storage_ptr__,(hasher *)&local_40);
  lcrypto::hasher::~hasher((hasher *)&local_40);
  async_call<void(libtorrent::aux::session_impl::*)(libtorrent::entry_const&,libtorrent::digest32<160l>),libtorrent::entry&,libtorrent::digest32<160l>const&>
            (this,0x2cb522,(entry *)0x0,(digest32<160L> *)data);
  if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

sha1_hash session_handle::dht_put_item(entry data)
	{
		std::vector<char> buf;
		bencode(std::back_inserter(buf), data);
		sha1_hash const ret = hasher(buf).final();

#ifndef TORRENT_DISABLE_DHT
		async_call(&session_impl::dht_put_immutable_item, data, ret);
#endif
		return ret;
	}